

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_logging.cc
# Opt level: O0

bool __thiscall tcmalloc::Logger::Add(Logger *this,LogItem *item)

{
  char *str;
  bool bVar1;
  size_t sVar2;
  bool local_3a;
  bool local_39;
  LogItem *item_local;
  Logger *this_local;
  
  if (this->p_ < this->end_) {
    *this->p_ = ' ';
    this->p_ = this->p_ + 1;
  }
  switch(item->tag_) {
  case kStr:
    str = (item->u_).str;
    sVar2 = strlen((item->u_).str);
    this_local._7_1_ = AddStr(this,str,(int)sVar2);
    break;
  case kSigned:
    if ((item->u_).snum < 0) {
      bVar1 = AddStr(this,"-",1);
      local_39 = false;
      if (bVar1) {
        local_39 = AddNum(this,-(item->u_).snum,10);
      }
      this_local._7_1_ = local_39;
    }
    else {
      this_local._7_1_ = AddNum(this,(item->u_).unum,10);
    }
    break;
  case kUnsigned:
    this_local._7_1_ = AddNum(this,(item->u_).unum,10);
    break;
  case kPtr:
    bVar1 = AddStr(this,"0x",2);
    local_3a = false;
    if (bVar1) {
      local_3a = AddNum(this,(item->u_).unum,0x10);
    }
    this_local._7_1_ = local_3a;
    break;
  default:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Logger::Add(const LogItem& item) {
  // Separate items with spaces
  if (p_ < end_) {
    *p_ = ' ';
    p_++;
  }

  switch (item.tag_) {
    case LogItem::kStr:
      return AddStr(item.u_.str, strlen(item.u_.str));
    case LogItem::kUnsigned:
      return AddNum(item.u_.unum, 10);
    case LogItem::kSigned:
      if (item.u_.snum < 0) {
        // The cast to uint64_t is intentionally before the negation
        // so that we do not attempt to negate -2^63.
        return AddStr("-", 1)
            && AddNum(- static_cast<uint64_t>(item.u_.snum), 10);
      } else {
        return AddNum(static_cast<uint64_t>(item.u_.snum), 10);
      }
    case LogItem::kPtr:
      return AddStr("0x", 2)
          && AddNum(reinterpret_cast<uintptr_t>(item.u_.ptr), 16);
    default:
      return false;
  }
}